

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_padlock.c
# Opt level: O0

int padlock_ofb_cipher(EVP_CIPHER_CTX *ctx,uchar *out_arg,uchar *in_arg,size_t nbytes)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  byte *pbVar4;
  uchar *puVar5;
  ulong uVar6;
  ulong in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  int in_stack_0000001c;
  uchar *ivp_1;
  uchar *ivp;
  size_t chunk;
  padlock_cipher_data *cdata;
  byte *local_48;
  ulong local_38;
  ulong local_28;
  byte *local_20;
  byte *local_18;
  
  pvVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  pvVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  pbVar4 = (byte *)((long)pvVar2 + (0x10 - ((ulong)pvVar3 & 0xf) & 0xf));
  iVar1 = EVP_CIPHER_CTX_get_num((EVP_CIPHER_CTX *)chunk);
  local_38 = (ulong)iVar1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_38 != 0) {
    puVar5 = EVP_CIPHER_CTX_iv_noconst((EVP_CIPHER_CTX *)chunk);
    if (0xf < local_38) {
      return 0;
    }
    for (; local_38 < 0x10 && local_28 != 0; local_38 = local_38 + 1) {
      *local_18 = *local_20 ^ puVar5[local_38];
      local_28 = local_28 - 1;
      local_20 = local_20 + 1;
      local_18 = local_18 + 1;
    }
    EVP_CIPHER_CTX_set_num((EVP_CIPHER_CTX *)ivp_1,in_stack_0000001c);
  }
  if (local_28 != 0) {
    puVar5 = EVP_CIPHER_CTX_iv((EVP_CIPHER_CTX *)chunk);
    *(undefined8 *)pbVar4 = *(undefined8 *)puVar5;
    *(undefined8 *)(pbVar4 + 8) = *(undefined8 *)(puVar5 + 8);
    uVar6 = local_28 & 0xfffffffffffffff0;
    if (uVar6 != 0) {
      iVar1 = padlock_ofb_encrypt(local_18,local_20,pbVar4,uVar6);
      if (iVar1 == 0) {
        return 0;
      }
      local_28 = local_28 - uVar6;
    }
    if (local_28 != 0) {
      EVP_CIPHER_CTX_set_num((EVP_CIPHER_CTX *)ivp_1,in_stack_0000001c);
      padlock_reload_key();
      padlock_aes_block(pbVar4,pbVar4,pbVar4);
      padlock_reload_key();
      local_48 = pbVar4;
      local_20 = local_20 + uVar6;
      local_18 = local_18 + uVar6;
      for (; local_28 != 0; local_28 = local_28 - 1) {
        *local_18 = *local_20 ^ *local_48;
        local_48 = local_48 + 1;
        local_20 = local_20 + 1;
        local_18 = local_18 + 1;
      }
    }
    puVar5 = EVP_CIPHER_CTX_iv_noconst((EVP_CIPHER_CTX *)chunk);
    *(undefined8 *)puVar5 = *(undefined8 *)pbVar4;
    *(undefined8 *)(puVar5 + 8) = *(undefined8 *)(pbVar4 + 8);
  }
  return 1;
}

Assistant:

static int
padlock_ofb_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out_arg,
                   const unsigned char *in_arg, size_t nbytes)
{
    struct padlock_cipher_data *cdata = ALIGNED_CIPHER_DATA(ctx);
    size_t chunk;

    /*
     * ctx->num is maintained in byte-oriented modes, such as CFB and OFB...
     */
    if ((chunk = EVP_CIPHER_CTX_get_num(ctx))) {   /* borrow chunk variable */
        unsigned char *ivp = EVP_CIPHER_CTX_iv_noconst(ctx);

        if (chunk >= AES_BLOCK_SIZE)
            return 0;           /* bogus value */

        while (chunk < AES_BLOCK_SIZE && nbytes != 0) {
            *(out_arg++) = *(in_arg++) ^ ivp[chunk];
            chunk++, nbytes--;
        }

        EVP_CIPHER_CTX_set_num(ctx, chunk % AES_BLOCK_SIZE);
    }

    if (nbytes == 0)
        return 1;

    memcpy(cdata->iv, EVP_CIPHER_CTX_iv(ctx), AES_BLOCK_SIZE);

    if ((chunk = nbytes & ~(AES_BLOCK_SIZE - 1))) {
        if (!padlock_ofb_encrypt(out_arg, in_arg, cdata, chunk))
            return 0;
        nbytes -= chunk;
    }

    if (nbytes) {
        unsigned char *ivp = cdata->iv;

        out_arg += chunk;
        in_arg += chunk;
        EVP_CIPHER_CTX_set_num(ctx, nbytes);
        padlock_reload_key();   /* empirically found */
        padlock_aes_block(ivp, ivp, cdata);
        padlock_reload_key();   /* empirically found */
        while (nbytes) {
            *(out_arg++) = *(in_arg++) ^ *ivp;
            ivp++, nbytes--;
        }
    }

    memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), cdata->iv, AES_BLOCK_SIZE);

    return 1;
}